

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  void *__src;
  long lVar1;
  bool bVar2;
  void *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar3;
  FilePath FVar4;
  undefined1 local_58 [8];
  String dot_extension;
  
  String::Format((String *)local_58,".%s");
  bVar2 = String::EndsWithCaseInsensitive((String *)extension,(char *)local_58);
  if (bVar2) {
    __src = *(void **)extension;
    lVar1 = *(long *)(extension + 8);
    __dest = operator_new__(lVar1 - 3);
    memcpy(__dest,__src,lVar1 - 4);
    *(undefined1 *)((long)__dest + lVar1 + -4) = 0;
    dot_extension.length_ = (size_t)__dest;
    FilePath(this,(String *)&dot_extension.length_);
    sVar3 = extraout_RDX;
    if (dot_extension.length_ != 0) {
      operator_delete__((void *)dot_extension.length_);
      sVar3 = extraout_RDX_00;
    }
  }
  else {
    (this->pathname_).c_str_ = (char *)0x0;
    (this->pathname_).length_ = 0;
    String::operator=(&this->pathname_,(String *)extension);
    sVar3 = extraout_RDX_01;
  }
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_58);
    sVar3 = extraout_RDX_02;
  }
  FVar4.pathname_.length_ = sVar3;
  FVar4.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar4.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}